

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O0

void SL::WS_LITE::
     handleclose<std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::basic_stream_socket<asio::ip::tcp>>>>
               (shared_ptr<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                *socket,unsigned_short code,string *msg)

{
  bool bVar1;
  ostream *this;
  element_type *peVar2;
  element_type *peVar3;
  lowest_layer_type *plVar4;
  undefined1 local_1c8 [8];
  error_code ec;
  ostringstream local_198 [8];
  ostringstream buffersl134nonesd;
  string *msg_local;
  unsigned_short code_local;
  shared_ptr<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>_> *socket_local
  ;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  this = std::operator<<((ostream *)local_198,"Closed: ");
  std::ostream::operator<<(this,code);
  Log(INFO_log_level,
      "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/include/internal/WebSocketProtocol.h"
      ,0xdd,"handleclose",(ostringstream *)local_198);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  peVar2 = std::
           __shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)socket);
  peVar2->SocketStatus_ = CLOSED;
  peVar2 = std::
           __shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)socket);
  peVar2->Writing = NOTWRITING;
  peVar2 = std::
           __shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)socket);
  peVar3 = std::
           __shared_ptr_access<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&peVar2->Parent);
  bVar1 = std::function::operator_cast_to_bool((function *)&peVar3->onDisconnection);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)socket);
    peVar3 = std::
             __shared_ptr_access<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar2->Parent);
    std::shared_ptr<SL::WS_LITE::IWebSocket>::
    shared_ptr<SL::WS_LITE::WebSocket<true,asio::basic_stream_socket<asio::ip::tcp>>,void>
              ((shared_ptr<SL::WS_LITE::IWebSocket> *)&ec._M_cat,socket);
    std::
    function<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(&peVar3->onDisconnection,(shared_ptr<SL::WS_LITE::IWebSocket> *)&ec._M_cat,code,msg
                );
    std::shared_ptr<SL::WS_LITE::IWebSocket>::~shared_ptr
              ((shared_ptr<SL::WS_LITE::IWebSocket> *)&ec._M_cat);
  }
  peVar2 = std::
           __shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)socket);
  std::deque<SL::WS_LITE::SendQueueItem,_std::allocator<SL::WS_LITE::SendQueueItem>_>::clear
            (&peVar2->SendMessageQueue);
  peVar2 = std::
           __shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)socket);
  WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>::canceltimers(peVar2);
  std::error_code::error_code((error_code *)local_1c8);
  peVar2 = std::
           __shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)socket);
  plVar4 = asio::basic_socket<asio::ip::tcp>::lowest_layer
                     (&(peVar2->Socket).super_basic_socket<asio::ip::tcp>);
  asio::basic_socket<asio::ip::tcp>::shutdown(plVar4,2,(int)local_1c8);
  std::error_code::clear((error_code *)local_1c8);
  peVar2 = std::
           __shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)socket);
  plVar4 = asio::basic_socket<asio::ip::tcp>::lowest_layer
                     (&(peVar2->Socket).super_basic_socket<asio::ip::tcp>);
  asio::basic_socket<asio::ip::tcp>::close(plVar4,(int)local_1c8);
  return;
}

Assistant:

inline void handleclose(const SOCKETTYPE &socket, unsigned short code, const std::string &msg)
    {
        SL_WS_LITE_LOG(Logging_Levels::INFO_log_level, "Closed: " << code);
        socket->SocketStatus_ = SocketStatus::CLOSED;
        socket->Writing = SocketIOStatus::NOTWRITING;
        if (socket->Parent->onDisconnection) {
            socket->Parent->onDisconnection(socket, code, msg);
        }

        socket->SendMessageQueue.clear(); // clear all outbound messages
        socket->canceltimers();
        std::error_code ec;
        socket->Socket.lowest_layer().shutdown(asio::ip::tcp::socket::shutdown_both, ec);
        ec.clear();
        socket->Socket.lowest_layer().close(ec);
    }